

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Function.cpp
# Opt level: O1

int __thiscall luna::Function::AddConstValue(Function *this,Value *v)

{
  pointer *ppVVar1;
  iterator __position;
  ValueT VVar2;
  undefined4 uVar3;
  
  __position._M_current =
       (this->const_values_).super__Vector_base<luna::Value,_std::allocator<luna::Value>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->const_values_).super__Vector_base<luna::Value,_std::allocator<luna::Value>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<luna::Value,std::allocator<luna::Value>>::_M_realloc_insert<luna::Value_const&>
              ((vector<luna::Value,std::allocator<luna::Value>> *)&this->const_values_,__position,v)
    ;
  }
  else {
    VVar2 = v->type_;
    uVar3 = *(undefined4 *)&v->field_0xc;
    (__position._M_current)->field_0 = v->field_0;
    (__position._M_current)->type_ = VVar2;
    *(undefined4 *)&(__position._M_current)->field_0xc = uVar3;
    ppVVar1 = &(this->const_values_).super__Vector_base<luna::Value,_std::allocator<luna::Value>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    *ppVVar1 = *ppVVar1 + 1;
  }
  return (int)((ulong)((long)(this->const_values_).
                             super__Vector_base<luna::Value,_std::allocator<luna::Value>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)(this->const_values_).
                            super__Vector_base<luna::Value,_std::allocator<luna::Value>_>._M_impl.
                            super__Vector_impl_data._M_start) >> 4) + -1;
}

Assistant:

int Function::AddConstValue(const Value &v)
    {
        const_values_.push_back(v);
        return const_values_.size() - 1;
    }